

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::UnitTest::set_current_test_info(UnitTest *this,TestInfo *a_current_test_info)

{
  TestInfo *in_RSI;
  GTestMutexLock *in_RDI;
  MutexLock lock;
  MutexBase *in_stack_ffffffffffffffc8;
  
  internal::GTestMutexLock::GTestMutexLock(in_RDI,in_stack_ffffffffffffffc8);
  internal::UnitTestImpl::set_current_test_info((UnitTestImpl *)in_RDI[8].mutex_,in_RSI);
  internal::GTestMutexLock::~GTestMutexLock((GTestMutexLock *)0x1e9805);
  return;
}

Assistant:

void UnitTest::set_current_test_info(TestInfo* a_current_test_info) {
  internal::MutexLock lock(&mutex_);
  impl_->set_current_test_info(a_current_test_info);
}